

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall
ON_SubDManagedMeshFragment::CopyHelper(ON_SubDManagedMeshFragment *this,ON_SubDMeshFragment *src)

{
  ON_3dVector quad_normal_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong vertex_capacity_00;
  double *pdVar4;
  ON_SurfaceCurvature *pOVar5;
  ON_Color *pOVar6;
  ON_Color *c1;
  ON_Color *c;
  size_t src_c_stride;
  ON_Color *src_c;
  ON_SurfaceCurvature *k1;
  ON_SurfaceCurvature *k;
  size_t src_k_stride;
  ON_SurfaceCurvature *src_k;
  double *p1;
  double *p;
  size_t src_p_stride;
  double *src_p;
  double nan3 [3];
  undefined1 local_b0 [8];
  ON_3dVector quad_normal;
  ON_3dPoint quad_points [4];
  uint local_30;
  uint C_count;
  uint K_count;
  uint T_count;
  uint N_count;
  uint P_count;
  size_t vertex_capacity;
  ON_SubDMeshFragment *src_local;
  ON_SubDManagedMeshFragment *this_local;
  
  if (this != (ON_SubDManagedMeshFragment *)src) {
    ON_SubDMeshFragment::Clear(&this->super_ON_SubDMeshFragment);
    uVar2 = ON_SubDMeshFragment::VertexCount(src);
    vertex_capacity_00 = (ulong)uVar2;
    if (vertex_capacity_00 != 0) {
      uVar2 = ON_SubDMeshFragment::PointCount(src);
      if ((uVar2 == 0) || (vertex_capacity_00 == uVar2)) {
        K_count = ON_SubDMeshFragment::NormalCount(src);
        if ((K_count != 0) && (vertex_capacity_00 != K_count)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4a8,"","invalid src.NormalCount()");
          K_count = 0;
        }
        C_count = ON_SubDMeshFragment::TextureCoordinateCount(src);
        if ((C_count != 0) && (vertex_capacity_00 != C_count)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4af,"","invalid src.TextureCoordinateCount()");
          C_count = 0;
        }
        local_30 = ON_SubDMeshFragment::CurvatureCount(src);
        if ((local_30 != 0) && (vertex_capacity_00 != local_30)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4b6,"","invalid src.CurvatureCount()");
          local_30 = 0;
        }
        quad_points[3].z._4_4_ = ON_SubDMeshFragment::ColorCount(src);
        if ((quad_points[3].z._4_4_ != 0) && (vertex_capacity_00 != quad_points[3].z._4_4_)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4bd,"","invalid src.ColorCount()");
          quad_points[3].z._4_4_ = 0;
        }
        uVar3 = ON_SubDMeshFragment::VertexCapacity(&this->super_ON_SubDMeshFragment);
        if (uVar3 < vertex_capacity_00) {
          bVar1 = ON_SubDMeshFragment::UnmanagedArrays(&this->super_ON_SubDMeshFragment);
          if ((bVar1) &&
             (uVar3 = ON_SubDMeshFragment::VertexCapacity(&this->super_ON_SubDMeshFragment),
             uVar3 != 0)) {
            ON_SubDIncrementErrorCount();
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                       ,0x4c6,"","unmanaged array capacity is too small.");
            return;
          }
          bVar1 = ON_SubDMeshFragment::ManagedArrays(&this->super_ON_SubDMeshFragment);
          if (bVar1) {
            ON_SubDMeshFragment::DeleteManagedArrays(&this->super_ON_SubDMeshFragment);
          }
          (this->super_ON_SubDMeshFragment).m_vertex_count_etc = 0;
          (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc = 0;
          (this->super_ON_SubDMeshFragment).m_P = (double *)0x0;
          ON_SubDMeshFragment::Internal_LayoutArrays
                    (&this->super_ON_SubDMeshFragment,vertex_capacity_00,(double *)0x0);
        }
        uVar3 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
        if (uVar3 < vertex_capacity_00) {
          C_count = 0;
        }
        uVar3 = ON_SubDMeshFragment::CurvatureCapacity(&this->super_ON_SubDMeshFragment);
        if (uVar3 < vertex_capacity_00) {
          local_30 = 0;
        }
        uVar3 = ON_SubDMeshFragment::ColorCapacity(&this->super_ON_SubDMeshFragment);
        if (uVar3 < vertex_capacity_00) {
          quad_points[3].z._4_4_ = 0;
        }
        ON_SubDMeshFragment::SetVertexCount(&this->super_ON_SubDMeshFragment,vertex_capacity_00);
        if ((src->m_vertex_count_etc & 0x8000) == 0) {
          (this->super_ON_SubDMeshFragment).m_vertex_count_etc =
               (this->super_ON_SubDMeshFragment).m_vertex_count_etc & 0x7fff;
        }
        else {
          (this->super_ON_SubDMeshFragment).m_vertex_count_etc =
               (this->super_ON_SubDMeshFragment).m_vertex_count_etc | 0x8000;
        }
        if (C_count != 0) {
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][0] = src->m_ctrlnetT[0][0];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][1] = src->m_ctrlnetT[0][1];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][2] = src->m_ctrlnetT[0][2];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][0] = src->m_ctrlnetT[1][0];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][1] = src->m_ctrlnetT[1][1];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][2] = src->m_ctrlnetT[1][2];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][0] = src->m_ctrlnetT[2][0];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][1] = src->m_ctrlnetT[2][1];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][2] = src->m_ctrlnetT[2][2];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][0] = src->m_ctrlnetT[3][0];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][1] = src->m_ctrlnetT[3][1];
          (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][2] = src->m_ctrlnetT[3][2];
        }
        if (local_30 != 0) {
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k1 = src->m_ctrlnetK[0].k1;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k2 = src->m_ctrlnetK[0].k2;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k1 = src->m_ctrlnetK[1].k1;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k2 = src->m_ctrlnetK[1].k2;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k1 = src->m_ctrlnetK[2].k1;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k2 = src->m_ctrlnetK[2].k2;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k1 = src->m_ctrlnetK[3].k1;
          (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k2 = src->m_ctrlnetK[3].k2;
        }
        if (quad_points[3].z._4_4_ != 0) {
          (this->super_ON_SubDMeshFragment).m_ctrlnetC[0].field_0 = src->m_ctrlnetC[0].field_0;
          (this->super_ON_SubDMeshFragment).m_ctrlnetC[1].field_0 = src->m_ctrlnetC[1].field_0;
          (this->super_ON_SubDMeshFragment).m_ctrlnetC[2].field_0 = src->m_ctrlnetC[2].field_0;
          (this->super_ON_SubDMeshFragment).m_ctrlnetC[3].field_0 = src->m_ctrlnetC[3].field_0;
        }
        (this->super_ON_SubDMeshFragment).m_pack_rect[0][0] = src->m_pack_rect[0][0];
        (this->super_ON_SubDMeshFragment).m_pack_rect[0][1] = src->m_pack_rect[0][1];
        (this->super_ON_SubDMeshFragment).m_pack_rect[1][0] = src->m_pack_rect[1][0];
        (this->super_ON_SubDMeshFragment).m_pack_rect[1][1] = src->m_pack_rect[1][1];
        (this->super_ON_SubDMeshFragment).m_pack_rect[2][0] = src->m_pack_rect[2][0];
        (this->super_ON_SubDMeshFragment).m_pack_rect[2][1] = src->m_pack_rect[2][1];
        (this->super_ON_SubDMeshFragment).m_pack_rect[3][0] = src->m_pack_rect[3][0];
        (this->super_ON_SubDMeshFragment).m_pack_rect[3][1] = src->m_pack_rect[3][1];
        memcpy(&(this->super_ON_SubDMeshFragment).m_surface_bbox,&src->m_surface_bbox,0x30);
        memcpy(&(this->super_ON_SubDMeshFragment).m_grid,&src->m_grid,0x30);
        ON_SubDMeshFragment::GetControlNetQuad
                  (src,false,(ON_3dPoint *)&quad_normal.z,(ON_3dVector *)local_b0);
        quad_normal_00.y = quad_normal.x;
        quad_normal_00.x = (double)local_b0;
        quad_normal_00.z = quad_normal.y;
        ON_SubDMeshFragment::SetControlNetQuad
                  (&this->super_ON_SubDMeshFragment,false,(ON_3dPoint *)&quad_normal.z,
                   quad_normal_00);
        src_p = (double *)ON_DBL_QNAN;
        nan3[0] = ON_DBL_QNAN;
        nan3[1] = ON_DBL_QNAN;
        p1 = (this->super_ON_SubDMeshFragment).m_P;
        pdVar4 = p1 + (this->super_ON_SubDMeshFragment).m_P_stride * vertex_capacity_00;
        if (uVar2 == 0) {
          src_p_stride = (size_t)&src_p;
          p = (double *)0x0;
        }
        else {
          src_p_stride = (size_t)src->m_P;
          p = (double *)src->m_P_stride;
        }
        for (; p1 < pdVar4; p1 = p1 + (this->super_ON_SubDMeshFragment).m_P_stride) {
          *p1 = *(double *)src_p_stride;
          p1[1] = *(double *)(src_p_stride + 8);
          p1[2] = *(double *)(src_p_stride + 0x10);
          src_p_stride = (long)p * 8 + src_p_stride;
        }
        if (K_count == 0) {
          src_p_stride = (size_t)&src_p;
          p = (double *)0x0;
        }
        else {
          src_p_stride = (size_t)src->m_N;
          p = (double *)src->m_N_stride;
        }
        uVar2 = ON_SubDMeshFragment::NormalCapacity(&this->super_ON_SubDMeshFragment);
        if (vertex_capacity_00 <= uVar2) {
          p1 = (this->super_ON_SubDMeshFragment).m_N;
          pdVar4 = p1 + (this->super_ON_SubDMeshFragment).m_N_stride * vertex_capacity_00;
          for (; p1 < pdVar4; p1 = p1 + (this->super_ON_SubDMeshFragment).m_N_stride) {
            *p1 = *(double *)src_p_stride;
            p1[1] = *(double *)(src_p_stride + 8);
            p1[2] = *(double *)(src_p_stride + 0x10);
            src_p_stride = (long)p * 8 + src_p_stride;
          }
        }
        if (C_count == 0) {
          src_p_stride = (size_t)&src_p;
          p = (double *)0x0;
        }
        else {
          src_p_stride = (size_t)src->m_T;
          p = (double *)src->m_T_stride;
          ON_SubDMeshFragment::SetTextureCoordinatesExistForExperts
                    (&this->super_ON_SubDMeshFragment,true);
        }
        uVar2 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
        if (vertex_capacity_00 <= uVar2) {
          p1 = (this->super_ON_SubDMeshFragment).m_T;
          pdVar4 = p1 + (this->super_ON_SubDMeshFragment).m_T_stride * vertex_capacity_00;
          for (; p1 < pdVar4; p1 = p1 + (this->super_ON_SubDMeshFragment).m_T_stride) {
            *p1 = *(double *)src_p_stride;
            p1[1] = *(double *)(src_p_stride + 8);
            p1[2] = *(double *)(src_p_stride + 0x10);
            src_p_stride = (long)p * 8 + src_p_stride;
          }
        }
        if (local_30 == 0) {
          src_k_stride = (size_t)&ON_SurfaceCurvature::Nan;
          k = (ON_SurfaceCurvature *)0x0;
        }
        else {
          src_k_stride = (size_t)src->m_K;
          k = (ON_SurfaceCurvature *)src->m_K_stride;
          ON_SubDMeshFragment::SetCurvaturesExistForExperts(&this->super_ON_SubDMeshFragment,true);
        }
        uVar2 = ON_SubDMeshFragment::CurvatureCapacity(&this->super_ON_SubDMeshFragment);
        if (vertex_capacity_00 <= uVar2) {
          k1 = (this->super_ON_SubDMeshFragment).m_K;
          pOVar5 = k1 + (this->super_ON_SubDMeshFragment).m_K_stride * vertex_capacity_00;
          for (; k1 < pOVar5; k1 = k1 + (this->super_ON_SubDMeshFragment).m_K_stride) {
            k1->k1 = *(double *)src_k_stride;
            k1->k2 = *(double *)(src_k_stride + 8);
            src_k_stride = (long)k * 0x10 + src_k_stride;
          }
        }
        if (quad_points[3].z._4_4_ == 0) {
          src_c_stride = (size_t)&ON_Color::UnsetColor;
          c = (ON_Color *)0x0;
        }
        else {
          src_c_stride = (size_t)src->m_C;
          c = (ON_Color *)src->m_C_stride;
          ON_SubDMeshFragment::SetColorsExistForExperts(&this->super_ON_SubDMeshFragment,true);
        }
        uVar2 = ON_SubDMeshFragment::ColorCapacity(&this->super_ON_SubDMeshFragment);
        if (vertex_capacity_00 <= uVar2) {
          c1 = (this->super_ON_SubDMeshFragment).m_C;
          pOVar6 = c1 + (this->super_ON_SubDMeshFragment).m_C_stride * vertex_capacity_00;
          for (; c1 < pOVar6; c1 = c1 + (this->super_ON_SubDMeshFragment).m_C_stride) {
            c1->field_0 = *(anon_union_4_2_6147a14e_for_ON_Color_15 *)src_c_stride;
            src_c_stride = (long)c * 4 + src_c_stride;
          }
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                   ,0x4a1,"","invalid counts");
      }
    }
  }
  return;
}

Assistant:

void ON_SubDManagedMeshFragment::CopyHelper(const ON_SubDMeshFragment& src)
{
  // This makes an exact copy. 
  // See ON_SubDMeshFragment::CopyFrom() can copy high density to low density

  if (this == &src)
    return;
  
  ON_SubDMeshFragment::Clear();

  const size_t vertex_capacity = src.VertexCount();
  if (0 == vertex_capacity)
    return;

  const unsigned P_count = src.PointCount();
  if (0 != P_count && vertex_capacity != P_count)
  {
    ON_SUBD_ERROR("invalid counts");
    return;
  }

  unsigned N_count = src.NormalCount();
  if (0 != N_count && vertex_capacity != N_count)
  {
    ON_SUBD_ERROR("invalid src.NormalCount()");
    N_count = 0;
  }

  unsigned T_count = src.TextureCoordinateCount();
  if (0 != T_count && vertex_capacity != T_count)
  {
    ON_SUBD_ERROR("invalid src.TextureCoordinateCount()");
    T_count = 0;
  }

  unsigned K_count = src.CurvatureCount();
  if (0 != K_count && vertex_capacity != K_count)
  {
    ON_SUBD_ERROR("invalid src.CurvatureCount()");
    K_count = 0;
  }

  unsigned C_count = src.ColorCount();
  if (0 != C_count && vertex_capacity != C_count)
  {
    ON_SUBD_ERROR("invalid src.ColorCount()");
    C_count = 0;
  }


  if (vertex_capacity > this->VertexCapacity())
  {
    if (this->UnmanagedArrays() && this->VertexCapacity() > 0)
    {
      ON_SUBD_ERROR("unmanaged array capacity is too small.");
      return;
    }
    
    if (this->ManagedArrays())
      this->DeleteManagedArrays();

    // allocate managed arrays
    m_vertex_count_etc = 0;
    m_vertex_capacity_etc = 0;
    m_P = nullptr;
    this->Internal_LayoutArrays(vertex_capacity, nullptr);
  }

  if (this->TextureCoordinateCapacity() < vertex_capacity)
    T_count = 0;
  if (this->CurvatureCapacity() < vertex_capacity)
    K_count = 0;
  if (this->ColorCapacity() < vertex_capacity)
    C_count = 0;

  SetVertexCount(vertex_capacity);

  if (src.m_vertex_count_etc & ON_SubDMeshFragment::EtcControlNetQuadBit)
  {
    m_vertex_count_etc |= ON_SubDMeshFragment::EtcControlNetQuadBit;
  } 
  else
  {
    m_vertex_count_etc &= ~ON_SubDMeshFragment::EtcControlNetQuadBit;
  }

  if (T_count > 0)
  {
    m_ctrlnetT[0][0] = src.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src.m_ctrlnetT[3][2];
  }

  if (K_count > 0)
  {
    m_ctrlnetK[0] = src.m_ctrlnetK[0];
    m_ctrlnetK[1] = src.m_ctrlnetK[1];
    m_ctrlnetK[2] = src.m_ctrlnetK[2];
    m_ctrlnetK[3] = src.m_ctrlnetK[3];
  }

  if (C_count > 0)
  {
    m_ctrlnetC[0] = src.m_ctrlnetC[0];
    m_ctrlnetC[1] = src.m_ctrlnetC[1];
    m_ctrlnetC[2] = src.m_ctrlnetC[2];
    m_ctrlnetC[3] = src.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src.m_pack_rect[0][0];
  m_pack_rect[0][1] = src.m_pack_rect[0][1];
  m_pack_rect[1][0] = src.m_pack_rect[1][0];
  m_pack_rect[1][1] = src.m_pack_rect[1][1];
  m_pack_rect[2][0] = src.m_pack_rect[2][0];
  m_pack_rect[2][1] = src.m_pack_rect[2][1];
  m_pack_rect[3][0] = src.m_pack_rect[3][0];
  m_pack_rect[3][1] = src.m_pack_rect[3][1];

  this->m_surface_bbox = src.m_surface_bbox;
  this->m_grid = src.m_grid;

  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  src.GetControlNetQuad(false, quad_points, quad_normal);
  this->SetControlNetQuad(false, quad_points, quad_normal);


  const double nan3[3] = { ON_DBL_QNAN, ON_DBL_QNAN, ON_DBL_QNAN };
  const double* src_p;
  size_t src_p_stride;
  double* p;
  double* p1;

  // copy src.m_P[] to m_P[]
  p = m_P;
  p1 = p + (m_P_stride * vertex_capacity);
  if ( P_count > 0 )
  {
    src_p = src.m_P;
    src_p_stride = src.m_P_stride;
  }
  else
  {
    src_p = nan3;
    src_p_stride = 0;
  }
  while (p < p1)
  {
    p[0] = src_p[0];
    p[1] = src_p[1];
    p[2] = src_p[2];
    p += m_P_stride;
    src_p += src_p_stride;
  }

  // copy src.m_N[] to m_N[]
  if (N_count > 0)
  {
    src_p = src.m_N;
    src_p_stride = src.m_N_stride;
  }
  else
  {
    // Pierre, 2023-04-13: Set to Nan when empty source, to stay similar to ON_SubDMeshFragment::CopyFrom()
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->NormalCapacity() >= vertex_capacity)
  {
    p = m_N;
    p1 = p + (m_N_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_N_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_T[] to m_T[]
  if (T_count > 0)
  {
    src_p = src.m_T;
    src_p_stride = src.m_T_stride;
    SetTextureCoordinatesExistForExperts(true);
  }
  else
  {
    // set m_T[] to nans
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->TextureCoordinateCapacity() >= vertex_capacity)
  {
    p = m_T;
    p1 = p + (m_T_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_T_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_K[] to m_K[]
  const ON_SurfaceCurvature* src_k;
  size_t src_k_stride;
  if (K_count > 0)
  {
    // copy curvature
    src_k = src.m_K;
    src_k_stride = src.m_K_stride;
    SetCurvaturesExistForExperts(true);
  }
  else
  {
    src_k = &ON_SurfaceCurvature::Nan;
    src_k_stride = 0;
  }
  if (this->CurvatureCapacity() >= vertex_capacity)
  {
    ON_SurfaceCurvature* k = m_K;
    ON_SurfaceCurvature* k1 = k + (m_K_stride * vertex_capacity);
    while (k < k1)
    {
      *k = *src_k;
      k += m_K_stride;
      src_k += src_k_stride;
    }
  }

  // copy src.m_C[] to m_C[]
  const ON_Color* src_c;
  size_t src_c_stride;
  if (C_count > 0)
  {
    src_c = src.m_C;
    src_c_stride = src.m_C_stride;
    SetColorsExistForExperts(true);
  }
  else
  {
    src_c = &ON_Color::UnsetColor;
    src_c_stride = 0;
  }
  if (this->ColorCapacity() >= vertex_capacity)
  {
    ON_Color* c = m_C;
    ON_Color* c1 = c + (m_C_stride * vertex_capacity);
    while (c < c1)
    {
      *c = *src_c;
      c += m_C_stride;
      src_c += src_c_stride;
    }
  }


}